

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamReaderPrivate::checkPublicLiteral(QXmlStreamReaderPrivate *this,QStringView publicId)

{
  uint uVar1;
  storage_type_conflict sVar2;
  bool bVar3;
  storage_type_conflict sVar4;
  uint uVar5;
  long lVar6;
  long in_FS_OFFSET;
  QChar local_62;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  lVar6 = publicId.m_size;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  do {
    sVar4 = (storage_type_conflict)uVar5;
    if (lVar6 < 1) {
LAB_0035208a:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
        return;
      }
      __stack_chk_fail();
    }
    sVar2 = publicId.m_data[lVar6 + -1];
    uVar5 = (uint)(ushort)sVar2;
    if (0xff < uVar5) {
LAB_00352035:
      QXmlStream::tr((QString *)&local_60,"Unexpected character \'%1\' in public id literal.",
                     (char *)0x0,-1);
      local_62.ucs = sVar4;
      QString::arg<QChar,_true>((QString *)&local_48,(QString *)&local_60,&local_62,0,(QChar)0x20);
      raiseWellFormedError(this,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
      goto LAB_0035208a;
    }
    uVar1 = (uVar5 & 0xff) - 10;
    if (((0x36 < uVar1) || ((0x6b003fefc00009U >> ((ulong)uVar1 & 0x3f) & 1) == 0)) &&
       ((uVar5 & 0xff) != 0x5f)) {
      bVar3 = QtMiscUtils::isAsciiLetterOrNumber((uint)(ushort)sVar2);
      sVar4 = sVar2;
      if (!bVar3) goto LAB_00352035;
    }
    lVar6 = lVar6 + -1;
  } while( true );
}

Assistant:

void QXmlStreamReaderPrivate::checkPublicLiteral(QStringView publicId)
{
//#x20 | #xD | #xA | [a-zA-Z0-9] | [-'()+,./:=?;!*#@$_%]

    const char16_t *data = publicId.utf16();
    uchar c = 0;
    qsizetype i;
    for (i = publicId.size() - 1; i >= 0; --i) {
        if (data[i] < 256)
            switch ((c = data[i])) {
            case ' ': case '\n': case '\r': case '-': case '(': case ')':
            case '+': case ',': case '.': case '/': case ':': case '=':
            case '?': case ';': case '!': case '*': case '#': case '@':
            case '$': case '_': case '%': case '\'': case '\"':
                continue;
            default:
                if (isAsciiLetterOrNumber(c))
                    continue;
            }
        break;
    }
    if (i >= 0)
        raiseWellFormedError(QXmlStream::tr("Unexpected character '%1' in public id literal.").arg(QChar(QLatin1Char(c))));
}